

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_rapt.cc
# Opt level: O1

bool __thiscall
sptk::PitchExtractionByRapt::Get
          (PitchExtractionByRapt *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  float fVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int tmp_length;
  float *tmp_f0;
  int local_2c;
  float *local_28;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_00108746:
    bVar5 = false;
  }
  else {
    if (f0 != (vector<double,_std::allocator<double>_> *)0x0) {
      iVar6 = snack::cGet_f0(waveform,this->frame_shift_,this->sampling_rate_,this->lower_f0_,
                             this->upper_f0_,this->voicing_threshold_,&local_28,&local_2c);
      if (iVar6 != 0) goto LAB_00108746;
      lVar7 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar8 = lVar7 >> 3;
      auVar13._8_4_ = (int)(lVar7 >> 0x23);
      auVar13._0_8_ = lVar8;
      auVar13._12_4_ = 0x45300000;
      dVar12 = ceil(((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) /
                    (double)this->frame_shift_);
      iVar6 = (int)dVar12;
      if (iVar6 < local_2c) {
        local_2c = iVar6;
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)iVar6);
      lVar7 = (long)local_2c;
      pdVar2 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < lVar7) {
        lVar8 = lVar7 + 1;
        lVar11 = 0;
        do {
          *(double *)((long)pdVar2 + lVar11 * 2) = (double)*(float *)((long)local_28 + lVar11);
          lVar8 = lVar8 + -1;
          lVar11 = lVar11 + 4;
        } while (1 < lVar8);
      }
      auVar4 = _DAT_0012bcc0;
      auVar13 = _DAT_0012bcb0;
      pdVar3 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar2 + lVar7 != pdVar3) {
        fVar1 = local_28[lVar7 + -1];
        uVar9 = (long)pdVar3 + (-8 - (long)(pdVar2 + lVar7));
        auVar16._8_4_ = (int)uVar9;
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = (int)(uVar9 >> 0x20);
        auVar14._0_8_ = uVar9 >> 3;
        auVar14._8_8_ = auVar16._8_8_ >> 3;
        uVar10 = 0;
        auVar14 = auVar14 ^ _DAT_0012bcc0;
        do {
          auVar15._8_4_ = (int)uVar10;
          auVar15._0_8_ = uVar10;
          auVar15._12_4_ = (int)(uVar10 >> 0x20);
          auVar16 = (auVar15 | auVar13) ^ auVar4;
          if ((bool)(~(auVar16._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar16._0_4_ ||
                      auVar14._4_4_ < auVar16._4_4_) & 1)) {
            pdVar2[lVar7 + uVar10] = (double)fVar1;
          }
          if ((auVar16._12_4_ != auVar14._12_4_ || auVar16._8_4_ <= auVar14._8_4_) &&
              auVar16._12_4_ <= auVar14._12_4_) {
            pdVar2[lVar7 + uVar10 + 1] = (double)fVar1;
          }
          uVar10 = uVar10 + 2;
        } while (((uVar9 >> 3) + 2 & 0xfffffffffffffffe) != uVar10);
      }
      snack::ckfree(local_28);
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool PitchExtractionByRapt::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    float* tmp_f0;
    int tmp_length;
    if (0 != snack::cGet_f0(waveform, frame_shift_, sampling_rate_, lower_f0_,
                            upper_f0_, voicing_threshold_, &tmp_f0,
                            &tmp_length)) {
      return false;
    }
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_length = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0, tmp_f0 + tmp_length, f0->begin());
    std::fill(f0->begin() + tmp_length, f0->end(), tmp_f0[tmp_length - 1]);
    snack::ckfree(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}